

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O2

int attachServiceClientTypeToLink(LINK_HANDLE link)

{
  int iVar1;
  AMQP_VALUE map;
  AMQP_VALUE key;
  AMQP_VALUE value;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  map = amqpvalue_create_map();
  if (map == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x423;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
              ,"attachServiceClientTypeToLink",0x422,1,
              "Failed to create the map for service client type.");
    return 0x423;
  }
  key = amqpvalue_create_symbol("com.microsoft:client-version");
  if (key == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x42a;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"attachServiceClientTypeToLink",0x429,1,
                "Failed to create the key name for the service client type.");
    }
    goto LAB_00133974;
  }
  value = amqpvalue_create_string("iothubserviceclient/1.1.0");
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x431;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"attachServiceClientTypeToLink",0x430,1,
                "Failed to create the key value for the service client type.");
    }
  }
  else {
    iVar1 = amqpvalue_set_map_value(map,key,value);
    if (iVar1 == 0) {
      iVar1 = link_set_attach_properties(link,map);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = 
          "Unable to attach the service client type to the link properties. Error code is: %d";
          iVar3 = 0x43b;
          goto LAB_0013395b;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed to set the property map for the service client type.  Error code is: %d";
        iVar3 = 0x437;
LAB_0013395b:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"attachServiceClientTypeToLink",iVar3,1,pcVar4,iVar1);
      }
    }
    amqpvalue_destroy(value);
  }
  amqpvalue_destroy(key);
LAB_00133974:
  amqpvalue_destroy(map);
  return iVar1;
}

Assistant:

static int attachServiceClientTypeToLink(LINK_HANDLE link)
{
    fields attach_properties;
    AMQP_VALUE serviceClientTypeKeyName;
    AMQP_VALUE serviceClientTypeValue;
    int result;

    if ((attach_properties = amqpvalue_create_map()) == NULL)
    {
        LogError("Failed to create the map for service client type.");
        result = MU_FAILURE;
    }
    else
    {
        if ((serviceClientTypeKeyName = amqpvalue_create_symbol("com.microsoft:client-version")) == NULL)
        {
            LogError("Failed to create the key name for the service client type.");
            result = MU_FAILURE;
        }
        else
        {
            if ((serviceClientTypeValue = amqpvalue_create_string(IOTHUB_SERVICE_CLIENT_TYPE_PREFIX IOTHUB_SERVICE_CLIENT_BACKSLASH IOTHUB_SERVICE_CLIENT_VERSION)) == NULL)
            {
                LogError("Failed to create the key value for the service client type.");
                result = MU_FAILURE;
            }
            else
            {
                if ((result = amqpvalue_set_map_value(attach_properties, serviceClientTypeKeyName, serviceClientTypeValue)) != 0)
                {
                    LogError("Failed to set the property map for the service client type.  Error code is: %d", result);
                }
                else if ((result = link_set_attach_properties(link, attach_properties)) != 0)
                {
                    LogError("Unable to attach the service client type to the link properties. Error code is: %d", result);
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(serviceClientTypeValue);
            }

            amqpvalue_destroy(serviceClientTypeKeyName);
        }

        amqpvalue_destroy(attach_properties);
    }
    return result;
}